

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

_Bool parse_path_coordinates(char **begin,char *end,float *values,int offset,int count)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  float *has_comma;
  float *extraout_RDX;
  float *extraout_RDX_00;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pbVar6 = (byte *)(ulong)(uint)offset;
  uVar8 = 0;
  uVar9 = 0;
  has_comma = values;
  if (0 < count) {
    uVar9 = (ulong)(uint)count;
  }
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    pbVar3 = (byte *)*begin;
    if (pbVar3 < end) {
      pbVar6 = (byte *)0x0;
      if (*pbVar3 != 0x2d) {
        if (*pbVar3 == 0x2b) {
          pbVar3 = pbVar3 + 1;
        }
        goto LAB_0010a04d;
      }
      pbVar3 = pbVar3 + 1;
      fVar10 = -1.0;
    }
    else {
LAB_0010a04d:
      fVar10 = 1.0;
    }
    if (end <= pbVar3) break;
    pbVar6 = (byte *)CONCAT71((int7)((ulong)pbVar6 >> 8),*pbVar3);
    fVar13 = 0.0;
    if (*pbVar3 == 0x2e) {
      fVar12 = 0.0;
      pbVar4 = pbVar3;
    }
    else {
      uVar7 = (int)pbVar6 - 0x30;
      has_comma = (float *)(ulong)uVar7;
      if (9 < (byte)uVar7) break;
      fVar12 = 0.0;
      do {
        pbVar3 = pbVar3 + 1;
        uVar7 = ((uint)pbVar6 & 0xff) - 0x30;
        pbVar6 = (byte *)(ulong)uVar7;
        fVar12 = fVar12 * 10.0 + (float)(int)uVar7;
        pbVar4 = (byte *)end;
        if (end <= pbVar3) break;
        uVar7 = CONCAT31((int3)(uVar7 >> 8),*pbVar3);
        pbVar6 = (byte *)(ulong)uVar7;
        uVar7 = uVar7 - 0x30;
        has_comma = (float *)(ulong)uVar7;
        pbVar4 = pbVar3;
      } while ((byte)uVar7 < 10);
    }
    if ((pbVar4 < end) && (*pbVar4 == 0x2e)) {
      if ((end <= pbVar4 + 1) ||
         (bVar1 = pbVar4[1], has_comma = (float *)(ulong)bVar1, 9 < (byte)(bVar1 - 0x30))) break;
      fVar13 = 0.0;
      fVar11 = 1.0;
      pbVar6 = pbVar4 + 2;
      do {
        uVar7 = ((uint)has_comma & 0xff) - 0x30;
        has_comma = (float *)(ulong)uVar7;
        fVar13 = fVar13 * 10.0 + (float)(int)uVar7;
        fVar11 = fVar11 * 10.0;
        pbVar4 = (byte *)end;
        if (end <= pbVar6) break;
        bVar1 = *pbVar6;
        has_comma = (float *)(ulong)CONCAT31((int3)(uVar7 >> 8),bVar1);
        pbVar4 = pbVar6;
        pbVar6 = pbVar6 + 1;
      } while ((byte)(bVar1 - 0x30) < 10);
      fVar13 = fVar13 / fVar11;
      pbVar6 = (byte *)end;
    }
    fVar11 = 0.0;
    if ((pbVar4 < end) && (pbVar6 = (byte *)0x0, (*pbVar4 | 0x20) == 0x65)) {
      pbVar3 = pbVar4 + 1;
      pbVar6 = pbVar3;
      if (pbVar3 < end) {
        bVar1 = *pbVar3;
        pbVar4 = pbVar4 + 2;
        pbVar6 = pbVar4;
        if (bVar1 == 0x2b) goto LAB_0010a157;
        pbVar6 = pbVar3;
        if (bVar1 == 0x2d) {
          pbVar6 = pbVar4;
        }
        pbVar4 = &DAT_0011d7cc;
        fVar14 = *(float *)(&DAT_0011d7cc + (ulong)(bVar1 == 0x2d) * 4);
      }
      else {
LAB_0010a157:
        fVar14 = 1.0;
      }
      if (end <= pbVar6) break;
      uVar5 = CONCAT71((int7)((ulong)pbVar4 >> 8),*pbVar6);
      uVar7 = (int)uVar5 - 0x30;
      has_comma = (float *)(ulong)uVar7;
      if (9 < (byte)uVar7) break;
      do {
        pbVar6 = pbVar6 + 1;
        iVar2 = ((uint)uVar5 & 0xff) - 0x30;
        fVar11 = fVar11 * 10.0 + (float)iVar2;
        pbVar4 = (byte *)end;
        if (end <= pbVar6) break;
        uVar7 = CONCAT31((int3)((uint)iVar2 >> 8),*pbVar6);
        uVar5 = (ulong)uVar7;
        uVar7 = uVar7 - 0x30;
        has_comma = (float *)(ulong)uVar7;
        pbVar4 = pbVar6;
      } while ((byte)uVar7 < 10);
    }
    else {
      fVar14 = 1.0;
    }
    *begin = (char *)pbVar4;
    fVar10 = fVar10 * (fVar12 + fVar13);
    values[(uint)offset + uVar8] = fVar10;
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      fVar10 = powf(10.0,fVar11 * fVar14);
      fVar10 = fVar10 * values[(uint)offset + uVar8];
      values[(uint)offset + uVar8] = fVar10;
      has_comma = extraout_RDX;
    }
    if (3.4028235e+38 < ABS(fVar10)) break;
    plutovg_skip_ws_or_comma(begin,end,(_Bool *)has_comma);
    has_comma = extraout_RDX_00;
  }
  return (long)count <= (long)uVar8;
}

Assistant:

static inline bool parse_path_coordinates(const char** begin, const char* end, float values[6], int offset, int count)
{
    for(int i = 0; i < count; i++) {
        if(!plutovg_parse_number(begin, end, values + offset + i))
            return false;
        plutovg_skip_ws_or_comma(begin, end, NULL);
    }

    return true;
}